

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handleapi.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalDuplicateHandle
                    (CPalThread *pThread,HANDLE hSourceProcess,HANDLE hSource,HANDLE hTargetProcess,
                    LPHANDLE phDuplicate,DWORD dwDesiredAccess,BOOL bInheritHandle,DWORD dwOptions)

{
  bool bVar1;
  DWORD DVar2;
  DWORD DVar3;
  DWORD DVar4;
  DWORD cur_process_id;
  DWORD target_process_id;
  DWORD source_process_id;
  IPalObject *pobjSource;
  PAL_ERROR palError;
  DWORD dwDesiredAccess_local;
  LPHANDLE phDuplicate_local;
  HANDLE hTargetProcess_local;
  HANDLE hSource_local;
  HANDLE hSourceProcess_local;
  CPalThread *pThread_local;
  
  pobjSource._0_4_ = 0;
  _target_process_id = (IPalObject *)0x0;
  pobjSource._4_4_ = dwDesiredAccess;
  _palError = phDuplicate;
  phDuplicate_local = (LPHANDLE)hTargetProcess;
  hTargetProcess_local = hSource;
  hSource_local = hSourceProcess;
  hSourceProcess_local = pThread;
  DVar2 = GetCurrentProcessId();
  DVar3 = PROCGetProcessIDFromHandle(hSource_local);
  DVar4 = PROCGetProcessIDFromHandle(phDuplicate_local);
  if ((DVar3 == 0) || (DVar4 == 0)) {
    fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
            ,0x7d);
    fprintf(_stderr,"Can\'t duplicate handle: invalid source or destination process");
    pobjSource._0_4_ = 0x57;
  }
  else if ((DVar3 == DVar2) || (DVar4 == DVar2)) {
    if (bInheritHandle == 0) {
      if ((dwOptions & 0xfffffffc) == 0) {
        if ((dwOptions & 2) == 0) {
          fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                  ,0xa5);
          fprintf(_stderr,
                  "Can\'t duplicate handle : dwOptions is %#x which does not include DUPLICATE_SAME_ACCESS (%#x).\n"
                  ,(ulong)dwOptions,2);
          pobjSource._0_4_ = 0x57;
        }
        else if (_palError == (LPHANDLE)0x0) {
          fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                  ,0xac);
          fprintf(_stderr,"Can\'t duplicate handle : lpTargetHandle is NULL.\n");
        }
        else if ((DVar3 == DVar2) && (DVar4 == DVar2)) {
          bVar1 = HandleIsSpecial(hTargetProcess_local);
          if (bVar1) {
            if ((undefined1 *)hTargetProcess_local == &DAT_ffffff01) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              _target_process_id = g_pobjProcess;
              (*g_pobjProcess->_vptr_IPalObject[7])();
            }
            else {
              if ((undefined1 *)hTargetProcess_local != &DAT_ffffff03) {
                fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                        ,0xe4);
                fprintf(_stderr,"Duplication not supported for this special handle (%p)\n",
                        hTargetProcess_local);
                pobjSource._0_4_ = 6;
                goto LAB_003a1242;
              }
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              _target_process_id = CPalThread::GetThreadObject((CPalThread *)hSourceProcess_local);
              (*_target_process_id->_vptr_IPalObject[7])();
            }
          }
          else {
            pobjSource._0_4_ =
                 (**(code **)(*g_pObjectManager + 0x28))
                           (g_pObjectManager,hSourceProcess_local,hTargetProcess_local,
                            &aotDuplicateHandle,pobjSource._4_4_,&target_process_id);
            if ((PAL_ERROR)pobjSource != 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              goto LAB_003a1242;
            }
            pobjSource._0_4_ = 0;
          }
          pobjSource._0_4_ =
               (**(code **)(*g_pObjectManager + 0x18))
                         (g_pObjectManager,hSourceProcess_local,_target_process_id,pobjSource._4_4_,
                          0,0,_palError);
        }
        else {
          *_palError = hTargetProcess_local;
          pobjSource._0_4_ = 0;
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                ,0x9a);
        fprintf(_stderr,
                "Can\'t duplicate handle : dwOptions is %#x which is not a subset of (DUPLICATE_SAME_ACCESS|DUPLICATE_CLOSE_SOURCE) (%#x).\n"
                ,(ulong)dwOptions,3);
        pobjSource._0_4_ = 0x57;
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0x8e);
      fprintf(_stderr,"Can\'t duplicate handle : bInheritHandle is not FALSE.\n");
      pobjSource._0_4_ = 0x57;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
            ,0x87);
    fprintf(_stderr,
            "Can\'t duplicate handle : neither source or destinationprocesses are from current process"
           );
    pobjSource._0_4_ = 0x57;
  }
LAB_003a1242:
  if (_target_process_id != (IPalObject *)0x0) {
    (*_target_process_id->_vptr_IPalObject[8])(_target_process_id,hSourceProcess_local);
  }
  if ((dwOptions & 1) != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    InternalCloseHandle((CPalThread *)hSourceProcess_local,hTargetProcess_local);
  }
  return (PAL_ERROR)pobjSource;
}

Assistant:

PAL_ERROR
CorUnix::InternalDuplicateHandle(
    CPalThread *pThread,
    HANDLE hSourceProcess,
    HANDLE hSource,
    HANDLE hTargetProcess,
    LPHANDLE phDuplicate,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    DWORD dwOptions
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSource = NULL;
    
    DWORD source_process_id;
    DWORD target_process_id;
    DWORD cur_process_id;

    cur_process_id = GetCurrentProcessId();
    source_process_id = PROCGetProcessIDFromHandle(hSourceProcess);
    target_process_id = PROCGetProcessIDFromHandle(hTargetProcess);

    /* Check validity of process handles */
    if (0 == source_process_id || 0 == target_process_id)
    {
        ASSERT("Can't duplicate handle: invalid source or destination process");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    /* At least source or target process should be the current process. */
    if (source_process_id != cur_process_id
        && target_process_id != cur_process_id)
    {
        ASSERT("Can't duplicate handle : neither source or destination"
               "processes are from current process");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (FALSE != bInheritHandle)
    {
        ASSERT("Can't duplicate handle : bInheritHandle is not FALSE.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (dwOptions & ~(DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE))
    {
        ASSERT(
            "Can't duplicate handle : dwOptions is %#x which is not "
            "a subset of (DUPLICATE_SAME_ACCESS|DUPLICATE_CLOSE_SOURCE) "
            "(%#x).\n",
            dwOptions,
            DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }
    
    if (0 == (dwOptions & DUPLICATE_SAME_ACCESS))
    {
        ASSERT(
            "Can't duplicate handle : dwOptions is %#x which does not "
            "include DUPLICATE_SAME_ACCESS (%#x).\n",
            dwOptions,
            DUPLICATE_SAME_ACCESS);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (NULL == phDuplicate)
    {
        ASSERT("Can't duplicate handle : lpTargetHandle is NULL.\n");
        goto InternalDuplicateHandleExit;
    }

    /* Since handles can be remoted to others processes using PAL_LocalHsndleToRemote
       and PAL_RemoteHandleToLocal, DuplicateHandle needs some special handling
       when this scenario occurs.

       if hSourceProcessHandle is from another process OR
       hTargetProcessHandle is from another process but both aren't
       ( handled above ) return hSourceHandle.
    */
    if (source_process_id != cur_process_id
        || target_process_id != cur_process_id)
    {
        *phDuplicate = hSource;
        palError = NO_ERROR;
        goto InternalDuplicateHandleExit;
    }

    //
    // Obtain the source IPalObject
    //

    if (!HandleIsSpecial(hSource))
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hSource,
            &aotDuplicateHandle,
            dwDesiredAccess,
            &pobjSource
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to get object for source handle %p (%i)\n", hSource, palError);
            goto InternalDuplicateHandleExit;
        }            
    }
    else if (hPseudoCurrentProcess == hSource)
    {
        TRACE("Duplicating process pseudo handle(%p)\n", hSource);

        pobjSource = g_pobjProcess;
        pobjSource->AddReference();
    }
    else if (hPseudoCurrentThread == hSource)
    {
        TRACE("Duplicating thread pseudo handle(%p)\n", hSource);

        pobjSource = pThread->GetThreadObject();
        pobjSource->AddReference();
    }
    else
    {
        ASSERT("Duplication not supported for this special handle (%p)\n", hSource);
        palError = ERROR_INVALID_HANDLE;
        goto InternalDuplicateHandleExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pThread,
        pobjSource,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phDuplicate
        );

InternalDuplicateHandleExit:

    if (NULL != pobjSource)
    {
        pobjSource->ReleaseReference(pThread);
    }

    if (dwOptions & DUPLICATE_CLOSE_SOURCE)
    {
        //
        // Since DUPLICATE_CLOSE_SOURCE was specified the source handle
        // MUST be closed, even if an error occurred during the duplication
        // process
        //
        
        TRACE("DuplicateHandle closing source handle %p\n", hSource);
        InternalCloseHandle(pThread, hSource);
    }

    return palError;
}